

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>::
fulfill(AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend>
        *this,Void *value)

{
  ExceptionOr<kj::_::Void> local_170;
  
  if (this->waiting == true) {
    this->waiting = false;
    local_170.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_170.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=(&this->result,&local_170);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_170);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }